

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_abstractsingleroleserialiser.cpp
# Opt level: O1

void AbstractSingleRoleSerialiser::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  int iVar2;
  
  if (_c == WriteProperty) {
    if (_id == 0) {
      setRoleToSave((AbstractSingleRoleSerialiser *)_o,**_a);
      return;
    }
  }
  else if ((_c == ReadProperty) && (_id == 0)) {
    piVar1 = (int *)*_a;
    iVar2 = roleToSave((AbstractSingleRoleSerialiser *)_o);
    *piVar1 = iVar2;
    return;
  }
  return;
}

Assistant:

void AbstractSingleRoleSerialiser::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{

#ifndef QT_NO_PROPERTIES
    if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<AbstractSingleRoleSerialiser *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< int*>(_v) = _t->roleToSave(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<AbstractSingleRoleSerialiser *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setRoleToSave(*reinterpret_cast< int*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
    (void)_o;
    (void)_id;
    (void)_c;
    (void)_a;
}